

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int mbedtls_asn1_write_printable_string(uchar **p,uchar *start,char *text,size_t text_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t len;
  uchar *puVar4;
  
  len = 0xffffff94;
  if ((long)(int)text_len <= (long)*p - (long)start) {
    puVar4 = *p + -text_len;
    *p = puVar4;
    memcpy(puVar4,text,text_len);
    len = text_len & 0xffffffff;
  }
  iVar3 = (int)len;
  iVar2 = iVar3;
  if ((-1 < iVar3) && (iVar1 = mbedtls_asn1_write_len(p,start,len), iVar2 = iVar1, -1 < iVar1)) {
    puVar4 = *p;
    if ((long)puVar4 - (long)start < 1) {
      iVar2 = -0x6c;
    }
    else {
      *p = puVar4 + -1;
      puVar4[-1] = '\x13';
      iVar2 = 1;
    }
    if (puVar4 != start && -1 < (long)puVar4 - (long)start) {
      iVar2 = iVar1 + iVar3 + iVar2;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_write_printable_string( unsigned char **p, unsigned char *start,
                                 const char *text, size_t text_len )
{
    int ret;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_raw_buffer( p, start,
                  (const unsigned char *) text, text_len ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_PRINTABLE_STRING ) );

    return( (int) len );
}